

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void print_map_instructions(void)

{
  Term_clear();
  text_out_hook = text_out_to_screen;
  text_out_indent = L'\x05';
  Term_gotoxy(L'\x05',L'\x01');
  text_out_e(
            "    *    \n  #{light yellow}#{/} {light yellow}#{/}#  \n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n/{light yellow}##{/}{deep light blue}/{/}{yellow}@{/}{deep light blue}\\{/}{light yellow}##{/}\\\n*  {yellow}@{/}{orange}@{/}{yellow}@{/}  *  Welcome to First Age Angband!\n\\{light yellow}##{/}{deep light blue}\\{/}{yellow}@{/}{deep light blue}/{/}{light yellow}##{/}/\n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n  #{light yellow}#{/} {light yellow}#{/}#  \n    *    \n\nThere are different ways of structuring the world\nof FAangband; \'{light green}?{/}\' gives more details."
            );
  text_out_indent = L'\0';
  return;
}

Assistant:

static void print_map_instructions(void)
{
	/* Clear screen */
	Term_clear();

	/* Output to the screen */
	text_out_hook = text_out_to_screen;

	/* Indent output */
	text_out_indent = 5;
	Term_gotoxy(5, 1);

	/* Display some helpful information */
	text_out_e(MAP_TEXT);

	/* Reset text_out() indentation */
	text_out_indent = 0;
}